

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pit.c
# Opt level: O1

ndn_pit_entry_t * ndn_pit_find_or_insert(ndn_pit_t *self,uint8_t *name,size_t length)

{
  ndn_table_id_t nVar1;
  nametree_entry_t *entry;
  ndn_pit_entry_t *pnVar2;
  ndn_table_id_t nVar3;
  ulong uVar4;
  ndn_table_id_t *pnVar5;
  
  entry = ndn_nametree_find_or_insert(self->nametree,name,length);
  if (entry == (nametree_entry_t *)0x0) {
LAB_0010283d:
    pnVar2 = (ndn_pit_entry_t *)0x0;
  }
  else {
    if (entry->pit_id == 0xffff) {
      nVar1 = ndn_nametree_getid(self->nametree,entry);
      nVar3 = 0xffff;
      if ((ulong)self->capacity != 0) {
        pnVar5 = &self[5].capacity;
        uVar4 = 0;
        do {
          if (*pnVar5 == 0xffff) {
            pnVar5[-0xc] = 0;
            pnVar5[-0xb] = 0;
            pnVar5[-10] = 0;
            pnVar5[-9] = 0;
            pnVar5[-8] = 0;
            pnVar5[-7] = 0;
            pnVar5[-6] = 0;
            pnVar5[-5] = 0;
            pnVar5[-0x14] = 0;
            pnVar5[-0x13] = 0;
            pnVar5[-0x12] = 0;
            pnVar5[-0x11] = 0;
            pnVar5[-0x10] = 0;
            pnVar5[-0xf] = 0;
            pnVar5[-0xe] = 0;
            pnVar5[-0xd] = 0;
            pnVar5[-0x1c] = 0;
            pnVar5[-0x1b] = 0;
            pnVar5[-0x1a] = 0;
            pnVar5[-0x19] = 0;
            pnVar5[-0x18] = 0;
            pnVar5[-0x17] = 0;
            pnVar5[-0x16] = 0;
            pnVar5[-0x15] = 0;
            ((ndn_pit_t *)(pnVar5 + -4))->nametree = (ndn_nametree_t *)0x0;
            *pnVar5 = nVar1;
            nVar3 = (ndn_table_id_t)uVar4;
            break;
          }
          uVar4 = uVar4 + 1;
          pnVar5 = pnVar5 + 0x28;
        } while (self->capacity != uVar4);
      }
      entry->pit_id = nVar3;
      if (nVar3 == 0xffff) goto LAB_0010283d;
    }
    pnVar2 = (ndn_pit_entry_t *)((long)&self[1].nametree + (ulong)((uint)entry->pit_id * 0x50));
  }
  return pnVar2;
}

Assistant:

ndn_pit_entry_t*
ndn_pit_find_or_insert(ndn_pit_t* self, uint8_t* name, size_t length){
  nametree_entry_t* entry = ndn_nametree_find_or_insert(self->nametree, name, length);
  if(entry == NULL){
    return NULL;
  }
  if(entry->pit_id == NDN_INVALID_ID){
    entry->pit_id = ndn_pit_add_new_entry(self, ndn_nametree_getid(self->nametree, entry));
    NDN_LOG_DEBUG("[PIT] Add a new PIT entry\n");
    if(entry->pit_id == NDN_INVALID_ID){
      return NULL;
    }
  }
  return &self->slots[entry->pit_id];
}